

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9EngineConfig(jx9 *pEngine,sxi32 nOp,__va_list_tag *ap)

{
  uint uVar1;
  undefined8 *puVar2;
  sxu32 *psVar3;
  undefined8 *local_70;
  long *local_58;
  int *pLen;
  char **pzPtr;
  int rc;
  jx9_conf *pConf;
  __va_list_tag *ap_local;
  sxi32 nOp_local;
  jx9 *pEngine_local;
  
  pzPtr._4_4_ = 0;
  if (nOp != 1) {
    if (nOp == 2) {
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_58 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_58 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_58 + 1;
      }
      puVar2 = (undefined8 *)*local_58;
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_70 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_70 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_70 + 1;
      }
      psVar3 = (sxu32 *)*local_70;
      if (puVar2 == (undefined8 *)0x0) {
        pzPtr._4_4_ = -0x18;
      }
      else {
        SyBlobNullAppend(&(pEngine->xConf).sErrConsumer);
        *puVar2 = (pEngine->xConf).sErrConsumer.pBlob;
        if (psVar3 != (sxu32 *)0x0) {
          if ((pEngine->xConf).sErrConsumer.nByte < 2) {
            *psVar3 = 0;
          }
          else {
            *psVar3 = (pEngine->xConf).sErrConsumer.nByte;
          }
        }
      }
    }
    else {
      pzPtr._4_4_ = -0x18;
    }
  }
  return pzPtr._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9EngineConfig(jx9 *pEngine, sxi32 nOp, va_list ap)
{
	jx9_conf *pConf = &pEngine->xConf;
	int rc = JX9_OK;
	/* Perform the requested operation */
	switch(nOp){									 
	case JX9_CONFIG_ERR_LOG:{
		/* Extract compile-time error log if any */
		const char **pzPtr = va_arg(ap, const char **);
		int *pLen = va_arg(ap, int *);
		if( pzPtr == 0 ){
			rc = JX9_CORRUPT;
			break;
		}
		/* NULL terminate the error-log buffer */
		SyBlobNullAppend(&pConf->sErrConsumer);
		/* Point to the error-log buffer */
		*pzPtr = (const char *)SyBlobData(&pConf->sErrConsumer);
		if( pLen ){
			if( SyBlobLength(&pConf->sErrConsumer) > 1 /* NULL '\0' terminator */ ){
				*pLen = (int)SyBlobLength(&pConf->sErrConsumer);
			}else{
				*pLen = 0;
			}
		}
		break;
							}
	case JX9_CONFIG_ERR_ABORT:
		/* Reserved for future use */
		break;
	default:
		/* Unknown configuration verb */
		rc = JX9_CORRUPT;
		break;
	} /* Switch() */
	return rc;
}